

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llvm::DILineInfo,_4U>::~SmallVector(SmallVector<llvm::DILineInfo,_4U> *this)

{
  DILineInfo *S;
  undefined1 *__ptr;
  
  S = (DILineInfo *)
      (this->super_SmallVectorImpl<llvm::DILineInfo>).
      super_SmallVectorTemplateBase<llvm::DILineInfo,_false>.
      super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>.super_SmallVectorBase.BeginX;
  SmallVectorTemplateBase<llvm::DILineInfo,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llvm::DILineInfo>).
                   super_SmallVectorTemplateBase<llvm::DILineInfo,_false>.
                   super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>.super_SmallVectorBase.
                   Size);
  __ptr = (undefined1 *)
          (this->super_SmallVectorImpl<llvm::DILineInfo>).
          super_SmallVectorTemplateBase<llvm::DILineInfo,_false>.
          super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>.super_SmallVectorBase.BeginX;
  if ((SmallVectorStorage<llvm::DILineInfo,_4U> *)__ptr !=
      &this->super_SmallVectorStorage<llvm::DILineInfo,_4U>) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }